

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VecAttributesImpl.cpp
# Opt level: O3

int __thiscall xercesc_4_0::VecAttributesImpl::getIndex(VecAttributesImpl *this,XMLCh *qName)

{
  XMLCh XVar1;
  XMLCh XVar2;
  XMLAttr *this_00;
  XMLCh *pXVar3;
  XMLCh *pXVar4;
  XMLSize_t getAt;
  
  if (this->fCount != 0) {
    getAt = 0;
    do {
      this_00 = BaseRefVectorOf<xercesc_4_0::XMLAttr>::elementAt
                          (&this->fVector->super_BaseRefVectorOf<xercesc_4_0::XMLAttr>,getAt);
      pXVar3 = XMLAttr::getQName(this_00);
      if (pXVar3 == qName) goto LAB_002b6652;
      pXVar4 = qName;
      if (pXVar3 == (XMLCh *)0x0 || qName == (XMLCh *)0x0) {
        if (pXVar3 == (XMLCh *)0x0) {
          if (qName == (XMLCh *)0x0) goto LAB_002b6652;
LAB_002b6640:
          XVar1 = *pXVar4;
        }
        else {
          XVar1 = *pXVar3;
          if ((qName != (XMLCh *)0x0) && (XVar1 == L'\0')) goto LAB_002b6640;
        }
        if (XVar1 == L'\0') {
LAB_002b6652:
          return (int)getAt;
        }
      }
      else {
        do {
          XVar1 = *pXVar3;
          if (XVar1 == L'\0') goto LAB_002b6640;
          pXVar3 = pXVar3 + 1;
          XVar2 = *pXVar4;
          pXVar4 = pXVar4 + 1;
        } while (XVar1 == XVar2);
      }
      getAt = getAt + 1;
    } while (getAt < this->fCount);
  }
  return -1;
}

Assistant:

int VecAttributesImpl::getIndex(const XMLCh* const qName ) const
{
    //
    //  Search the vector for the attribute with the given name and return
    //  its type.
    //
    for (XMLSize_t index = 0; index < fCount; index++)
    {
        const XMLAttr* curElem = fVector->elementAt(index);

        if (XMLString::equals(curElem->getQName(), qName))
            return (int)index ;
    }
    return -1;
}